

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ContiguousMemoryRange __thiscall
protozero::ScatteredHeapBuffer::GetNewBuffer(ScatteredHeapBuffer *this)

{
  uint uVar1;
  code *pcVar2;
  char *fname;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  uint8_t *puVar6;
  unsigned_long *puVar7;
  reference this_00;
  ContiguousMemoryRange CVar8;
  unsigned_long local_28;
  ScatteredHeapBuffer *local_20;
  ScatteredHeapBuffer *this_local;
  
  local_20 = this;
  if (this->writer_ != (ScatteredStreamWriter *)0x0) {
    AdjustUsedSizeOfCurrentSlice(this);
    puVar6 = Slice::start(&this->cached_slice_);
    if (puVar6 == (uint8_t *)0x0) {
      std::
      vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
      ::emplace_back<unsigned_long&>
                ((vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
                  *)&this->slices_,&this->next_slice_size_);
    }
    else {
      perfetto::std::
      vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
      ::push_back(&this->slices_,&this->cached_slice_);
    }
    local_28 = this->next_slice_size_ * 2;
    puVar7 = std::min<unsigned_long>(&this->maximum_slice_size_,&local_28);
    this->next_slice_size_ = *puVar7;
    this_00 = perfetto::std::
              vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
              ::back(&this->slices_);
    CVar8 = Slice::GetTotalRange(this_00);
    return CVar8;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  perfetto::base::LogMessage
            (kLogError,fname,0x289a,"%s (errno: %d, %s)","PERFETTO_CHECK(writer_)",(ulong)uVar1,
             pcVar5);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

protozero::ContiguousMemoryRange ScatteredHeapBuffer::GetNewBuffer() {
  PERFETTO_CHECK(writer_);
  AdjustUsedSizeOfCurrentSlice();

  if (cached_slice_.start()) {
    slices_.push_back(std::move(cached_slice_));
    PERFETTO_DCHECK(!cached_slice_.start());
  } else {
    slices_.emplace_back(next_slice_size_);
  }
  next_slice_size_ = std::min(maximum_slice_size_, next_slice_size_ * 2);
  return slices_.back().GetTotalRange();
}